

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

bool canExchange(vector<CardType,_std::allocator<CardType>_> *cards)

{
  CardType CVar1;
  bool bVar2;
  reference pCVar3;
  bool local_42;
  bool local_41;
  const_iterator cStack_38;
  CardType i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CardType,_std::allocator<CardType>_> *__range1;
  int local_18;
  int numCavalry;
  int numArtillery;
  int numInfantry;
  vector<CardType,_std::allocator<CardType>_> *cards_local;
  
  numCavalry = 0;
  local_18 = 0;
  __range1._4_4_ = 0;
  __end1 = std::vector<CardType,_std::allocator<CardType>_>::begin(cards);
  cStack_38 = std::vector<CardType,_std::allocator<CardType>_>::end(cards);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8), bVar2) {
    pCVar3 = __gnu_cxx::
             __normal_iterator<const_CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>
             ::operator*(&__end1);
    CVar1 = *pCVar3;
    if (CVar1 == INFANTRY) {
      numCavalry = numCavalry + 1;
    }
    else if (CVar1 == ARTILLERY) {
      local_18 = local_18 + 1;
    }
    else if (CVar1 == CAVALRY) {
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>::
    operator++(&__end1);
  }
  local_41 = true;
  if (((local_18 < 3) && (local_41 = true, __range1._4_4_ < 3)) && (local_41 = true, numCavalry < 3)
     ) {
    local_42 = false;
    if ((0 < numCavalry) && (local_42 = false, 0 < local_18)) {
      local_42 = 0 < __range1._4_4_;
    }
    local_41 = local_42;
  }
  return local_41;
}

Assistant:

static bool canExchange(const std::vector<CardType> &cards) {
    int numInfantry = 0;
    int numArtillery = 0;
    int numCavalry = 0;
    for (const auto i: cards) {
        switch (i) {
            case CardType::INFANTRY:
                numInfantry++;
                break;
            case CardType::CAVALRY:
                numCavalry++;
                break;
            case CardType::ARTILLERY:
                numArtillery++;
                break;
        }
    }
    return (numArtillery >= 3 || numCavalry >= 3 || numInfantry >= 3 ||
            (numInfantry >= 1 && numArtillery >= 1 && numCavalry >= 1));
}